

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FpgaIO.cpp
# Opt level: O3

bool __thiscall FpgaIO::WriteReboot(FpgaIO *this)

{
  BasePort *pBVar1;
  uint32_t uVar2;
  int iVar3;
  
  uVar2 = BoardIO::GetFirmwareVersion(&this->super_BoardIO);
  if (uVar2 < 7) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"FpgaIO::WriteReboot: requires firmware 7 or above",0x31);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x50);
    std::ostream::put(-0x50);
    std::ostream::flush();
  }
  else {
    pBVar1 = (this->super_BoardIO).port;
    if (pBVar1 != (BasePort *)0x0) {
      iVar3 = (*pBVar1->_vptr_BasePort[0x24])
                        (pBVar1,(ulong)(this->super_BoardIO).BoardId,0,0x300000);
      return SUB41(iVar3,0);
    }
  }
  return false;
}

Assistant:

bool FpgaIO::WriteReboot(void)
{
    if (GetFirmwareVersion() < 7) {
        // Could instead allow this to be used with older firmware, where the "reboot"
        // flag was instead used as a "soft reset".
        std::cerr << "FpgaIO::WriteReboot: requires firmware 7 or above" << std::endl;
        return false;
    }
    uint32_t write_data = REBOOT_FPGA;
    return (port ? port->WriteQuadlet(BoardId, BoardIO::BOARD_STATUS, write_data) : false);
}